

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall
QMenuPrivate::scrollMenu(QMenuPrivate *this,QAction *action,ScrollLocation location,bool active)

{
  int *piVar1;
  int iVar2;
  QWidget *this_00;
  QRect *pQVar3;
  QWidgetData *pQVar4;
  QMenuScroller *pQVar5;
  Data *this_01;
  Representation RVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  QRect QVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  QStyle *pQVar16;
  pointer pQVar17;
  Node<QAction_*,_QWidget_*> *pNVar18;
  QWidget **ppQVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  QWidget *pQVar25;
  long lVar26;
  int iVar27;
  Representation RVar28;
  uint uVar29;
  ulong uVar30;
  long in_FS_OFFSET;
  QRect QVar31;
  byte local_60;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->scroll != (QMenuScroller *)0x0) && (this->scroll->scrollFlags != '\0')) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    iVar12 = 0;
    local_48 = popupGeometry(this,(QScreen *)0x0);
    updateActionRects(this,&local_48);
    iVar11 = 0;
    if ((this->scroll->scrollFlags & 1) != 0) {
      pQVar25 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
      pQVar16 = QWidget::style(pQVar25);
      iVar11 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1b,0,pQVar25);
    }
    if ((this->scroll->scrollFlags & 2) != 0) {
      pQVar25 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
      pQVar16 = QWidget::style(pQVar25);
      iVar12 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1b,0,pQVar25);
    }
    pQVar16 = QWidget::style(this_00);
    uVar15 = 0;
    iVar13 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1d,0,this_00);
    pQVar16 = QWidget::style(this_00);
    iVar14 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1e,0,this_00);
    lVar23 = (this->super_QWidgetPrivate).actions.d.size;
    if (location == ScrollTop) {
      if (lVar23 != 0) {
        pQVar3 = (this->actionRects).d.ptr;
        lVar26 = 0;
        iVar12 = 0;
        do {
          if (*(QAction **)((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar26) == action) {
            uVar15 = iVar11 - iVar12;
            goto LAB_004603e9;
          }
          iVar12 = ((iVar12 + *(int *)((long)&(pQVar3->y2).m_i + lVar26 * 2)) -
                   *(int *)((long)&(pQVar3->y1).m_i + lVar26 * 2)) + 1;
          lVar26 = lVar26 + 8;
        } while (lVar23 << 3 != lVar26);
      }
      uVar15 = 0;
    }
    else {
      if (lVar23 != 0) {
        pQVar3 = (this->actionRects).d.ptr;
        lVar26 = 0;
        iVar21 = 0;
        do {
          iVar21 = ((iVar21 + *(int *)((long)&(pQVar3->y2).m_i + lVar26 * 2)) -
                   *(int *)((long)&(pQVar3->y1).m_i + lVar26 * 2)) + 1;
          if (*(QAction **)((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar26) == action) {
            iVar2 = (this_00->data->crect).y1.m_i;
            iVar27 = (this_00->data->crect).y2.m_i;
            if (location == ScrollCenter) {
              iVar27 = iVar27 - iVar2;
              uVar15 = (iVar11 - (iVar12 + iVar21)) + ((iVar27 - (iVar27 + 1 >> 0x1f)) + 1 >> 1);
            }
            else {
              uVar15 = (iVar27 - (iVar12 + iVar21 + iVar2)) + 1;
            }
            goto LAB_004603de;
          }
          lVar26 = lVar26 + 8;
        } while (lVar23 << 3 != lVar26);
        uVar15 = 0;
      }
LAB_004603de:
      if (uVar15 != 0) {
        uVar15 = uVar15 + iVar14 * -2;
      }
    }
LAB_004603e9:
    uVar24 = -((int)uVar15 >> 0x1f);
    lVar23 = (this->actionRects).d.size;
    uVar29 = uVar24;
    uVar20 = uVar15;
    if (lVar23 != 0) {
      pQVar3 = (this->actionRects).d.ptr;
      lVar26 = 0;
      do {
        uVar20 = ((uVar20 + *(int *)((long)&(pQVar3->y2).m_i + lVar26)) -
                 *(int *)((long)&(pQVar3->y1).m_i + lVar26)) + 1;
        if (((this_00->data->crect).y2.m_i - (this_00->data->crect).y1.m_i) + 1 < (int)uVar20) {
          uVar29 = uVar24 + 2;
          break;
        }
        lVar26 = lVar26 + 0x10;
      } while (lVar23 << 4 != lVar26);
    }
    local_60 = (byte)uVar29;
    uVar22 = uVar15;
    if ((((uVar29 & 2) == 0) && ((this->scroll->scrollFlags & 2) != 0)) &&
       (uVar22 = (((uVar15 - (iVar13 + iVar14 * 2)) + (this_00->data->crect).y2.m_i) -
                 (uVar20 + (this_00->data->crect).y1.m_i +
                 (int)(this->super_QWidgetPrivate).bottommargin +
                 (int)(this->super_QWidgetPrivate).topmargin)) + 1, (this->field_0x421 & 2) != 0)) {
      pQVar16 = QWidget::style(this_00);
      iVar11 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x1f,0,this_00);
      uVar22 = uVar22 - iVar11;
    }
    if ((int)uVar15 < 0) {
      uVar15 = uVar22 - iVar13;
    }
    else {
      uVar15 = 0;
      if ((this->scroll->scrollFlags & 1) == 0) {
        uVar15 = uVar22;
      }
    }
    QVar31 = popupGeometry(this,(QScreen *)0x0);
    pQVar16 = QWidget::style(this_00);
    iVar11 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x20,0,this_00);
    pQVar4 = this_00->data;
    RVar6 = QVar31.y1.m_i;
    if (((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i) + 1 <
        QVar31.y2.m_i.m_i - (RVar6.m_i + iVar11 * 2)) {
      uVar7 = (pQVar4->crect).x1;
      uVar8 = (pQVar4->crect).x2;
      uVar9 = (pQVar4->crect).y2;
      local_48.y2.m_i = uVar9;
      local_48.x2.m_i = uVar8;
      QVar10 = pQVar4->crect;
      pQVar5 = this->scroll;
      iVar12 = pQVar5->scrollOffset;
      local_48.y1 = QVar10.y1.m_i;
      if ((uVar15 - iVar12 == 0 || (int)uVar15 < iVar12) || ((uVar24 & pQVar5->scrollFlags) == 0)) {
        uVar20._0_1_ = pQVar5->scrollFlags;
        uVar20._1_1_ = pQVar5->scrollDirection;
        uVar20._2_2_ = *(undefined2 *)&pQVar5->field_0xa;
        if ((uVar20 & uVar29 & 2) != 0) {
          RVar28.m_i = (uVar15 - iVar12) + local_48.y1.m_i;
          if (RVar28.m_i <= iVar11 + RVar6.m_i) {
            RVar28.m_i = iVar11 + RVar6.m_i;
          }
          if (RVar28.m_i < local_48.y1.m_i) {
            local_48.y1.m_i = RVar28.m_i;
            local_48.x1.m_i = uVar7;
            local_60 = local_60 & 0xfe;
            uVar15 = 0;
            QVar10 = local_48;
          }
        }
      }
      else if ((uVar9 - local_48.y1.m_i) + 1 <
               (int)((uVar9 - local_48.y1.m_i) + (iVar12 - uVar15) + 1)) {
        local_48._0_12_ = QVar10._0_12_;
        local_48.y2.m_i = uVar9 + (iVar12 - uVar15);
        QVar10 = local_48;
      }
      local_48 = QVar10;
      RVar28.m_i = QVar31.y2.m_i.m_i - iVar11;
      if (RVar28.m_i < local_48.y2.m_i) {
        local_48.y2.m_i = RVar28.m_i;
      }
      if (local_48.y1.m_i < iVar11 + RVar6.m_i) {
        local_48.y1.m_i = iVar11 + RVar6.m_i;
      }
      pQVar4 = this_00->data;
      if (((local_48.x1.m_i != (pQVar4->crect).x1.m_i) ||
          (local_48.x2.m_i != (pQVar4->crect).x2.m_i)) ||
         ((local_48.y1.m_i != (pQVar4->crect).y1.m_i || (local_48.y2.m_i != (pQVar4->crect).y2.m_i))
         )) {
        QWidget::setGeometry(this_00,&local_48);
      }
    }
    uVar15 = (int)uVar15 >> 0x1f & uVar15;
    uVar20 = this->scroll->scrollOffset;
    iVar11 = uVar15 - uVar20;
    if ((((this->field_0x420 & 1) == 0) && (uVar15 != uVar20)) && ((this->actionRects).d.size != 0))
    {
      lVar26 = 0;
      lVar23 = 0;
      uVar30 = 0;
      do {
        pQVar17 = QList<QRect>::data(&this->actionRects);
        piVar1 = (int *)((long)&(pQVar17->y2).m_i + lVar23 * 2);
        *piVar1 = *piVar1 + iVar11;
        piVar1 = (int *)((long)&(pQVar17->y1).m_i + lVar23 * 2);
        *piVar1 = *piVar1 + iVar11;
        this_01 = (this->widgetItems).d;
        if ((this_01 == (Data *)0x0) ||
           (pNVar18 = QHashPrivate::Data<QHashPrivate::Node<QAction*,QWidget*>>::findNode<QAction*>
                                ((Data<QHashPrivate::Node<QAction*,QWidget*>> *)this_01,
                                 (QAction **)
                                 ((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar23)),
           pNVar18 == (Node<QAction_*,_QWidget_*> *)0x0)) {
          ppQVar19 = (QWidget **)0x0;
        }
        else {
          ppQVar19 = &pNVar18->value;
        }
        if (ppQVar19 == (QWidget **)0x0) {
          pQVar25 = (QWidget *)0x0;
        }
        else {
          pQVar25 = *ppQVar19;
        }
        if (pQVar25 != (QWidget *)0x0) {
          QWidget::setGeometry(pQVar25,(QRect *)((long)&(pQVar17->x1).m_i + lVar26));
        }
        uVar30 = uVar30 + 1;
        lVar23 = lVar23 + 8;
        lVar26 = lVar26 + 0x10;
      } while (uVar30 < (ulong)(this->actionRects).d.size);
    }
    pQVar5 = this->scroll;
    pQVar5->scrollOffset = pQVar5->scrollOffset + iVar11;
    pQVar5->scrollFlags = local_60;
    if (active) {
      setCurrentAction(this,action,-1,SelectedFromElsewhere,false);
    }
    QWidget::update(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::scrollMenu(QAction *action, QMenuScroller::ScrollLocation location, bool active)
{
    Q_Q(QMenu);
    if (!scroll || !scroll->scrollFlags)
        return;
    updateActionRects();
    int newOffset = 0;
    const int topScroll = (scroll->scrollFlags & QMenuScroller::ScrollUp)   ? scrollerHeight() : 0;
    const int botScroll = (scroll->scrollFlags & QMenuScroller::ScrollDown) ? scrollerHeight() : 0;
    const int vmargin = q->style()->pixelMetric(QStyle::PM_MenuVMargin, nullptr, q);
    const int fw = q->style()->pixelMetric(QStyle::PM_MenuPanelWidth, nullptr, q);

    if (location == QMenuScroller::ScrollTop) {
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            if (actions.at(i) == action) {
                newOffset = topScroll - saccum;
                break;
            }
            saccum += actionRects.at(i).height();
        }
    } else {
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            saccum += actionRects.at(i).height();
            if (actions.at(i) == action) {
                if (location == QMenuScroller::ScrollCenter)
                    newOffset = ((q->height() / 2) - botScroll) - (saccum - topScroll);
                else
                    newOffset = (q->height() - botScroll) - saccum;
                break;
            }
        }
        if (newOffset)
            newOffset -= fw * 2;
    }

    //figure out which scroll flags
    uint newScrollFlags = QMenuScroller::ScrollNone;
    if (newOffset < 0) //easy and cheap one
        newScrollFlags |= QMenuScroller::ScrollUp;
    int saccum = newOffset;
    for(int i = 0; i < actionRects.size(); i++) {
        saccum += actionRects.at(i).height();
        if (saccum > q->height()) {
            newScrollFlags |= QMenuScroller::ScrollDown;
            break;
        }
    }

    if (!(newScrollFlags & QMenuScroller::ScrollDown) && (scroll->scrollFlags & QMenuScroller::ScrollDown)) {
        newOffset = q->height() - (saccum - newOffset) - fw*2 - vmargin - topmargin - bottommargin;    //last item at bottom
        if (tearoff)
            newOffset -= q->style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, q);
    }

    if (!(newScrollFlags & QMenuScroller::ScrollUp) && (scroll->scrollFlags & QMenuScroller::ScrollUp)) {
        newOffset = 0;  //first item at top
    }

    if (newScrollFlags & QMenuScroller::ScrollUp)
        newOffset -= vmargin;

    QRect screen = popupGeometry();
    const int desktopFrame = q->style()->pixelMetric(QStyle::PM_MenuDesktopFrameWidth, nullptr, q);
    if (q->height() < screen.height()-(desktopFrame*2)-1) {
        QRect geom = q->geometry();
        if (newOffset > scroll->scrollOffset && (scroll->scrollFlags & newScrollFlags & QMenuScroller::ScrollUp)) { //scroll up
            const int newHeight = geom.height()-(newOffset-scroll->scrollOffset);
            if (newHeight > geom.height())
                geom.setHeight(newHeight);
        } else if (scroll->scrollFlags & newScrollFlags & QMenuScroller::ScrollDown) {
            int newTop = geom.top() + (newOffset-scroll->scrollOffset);
            if (newTop < desktopFrame+screen.top())
                newTop = desktopFrame+screen.top();
            if (newTop < geom.top()) {
                geom.setTop(newTop);
                newOffset = 0;
                newScrollFlags &= ~QMenuScroller::ScrollUp;
            }
        }
        if (geom.bottom() > screen.bottom() - desktopFrame)
            geom.setBottom(screen.bottom() - desktopFrame);
        if (geom.top() < desktopFrame+screen.top())
            geom.setTop(desktopFrame+screen.top());
        if (geom != q->geometry()) {
#if 0
            if (newScrollFlags & QMenuScroller::ScrollDown &&
               q->geometry().top() - geom.top() >= -newOffset)
                newScrollFlags &= ~QMenuScroller::ScrollDown;
#endif
            q->setGeometry(geom);
        }
    }

    //actually update flags
    const int delta = qMin(0, newOffset) - scroll->scrollOffset; //make sure the new offset is always negative
    if (!itemsDirty && delta) {
        //we've scrolled so we need to update the action rects
        for (int i = 0; i < actionRects.size(); ++i) {
            QRect &current = actionRects[i];
            current.moveTop(current.top() + delta);

            //we need to update the widgets geometry
            if (QWidget *w = widgetItems.value(actions.at(i)))
                w->setGeometry(current);
        }
    }
    scroll->scrollOffset += delta;
    scroll->scrollFlags = newScrollFlags;
    if (active)
        setCurrentAction(action);

    q->update();     //issue an update so we see all the new state..
}